

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_strfilter(char *text,char *regexp)

{
  char cVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  char *local_10;
  int local_4;
  
  local_10 = in_RDI;
  if (*in_RSI == '^') {
    local_4 = nk_str_match_here(in_RSI,(char *)0x10765b);
  }
  else {
    do {
      iVar2 = nk_str_match_here(in_RSI,(char *)0x107671);
      if (iVar2 != 0) {
        return 1;
      }
      cVar1 = *local_10;
      local_10 = local_10 + 1;
    } while (cVar1 != '\0');
    local_4 = 0;
  }
  return local_4;
}

Assistant:

NK_API int
nk_strfilter(const char *text, const char *regexp)
{
/*
    c    matches any literal character c
    .    matches any single character
    ^    matches the beginning of the input string
    $    matches the end of the input string
    *    matches zero or more occurrences of the previous character*/
if (regexp[0] == '^')
return nk_str_match_here(regexp+1, text);
do {    /* must look even if string is empty */
if (nk_str_match_here(regexp, text))
return 1;
} while (*text++ != '\0');
return 0;
}